

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementQuantity::IfcElementQuantity(IfcElementQuantity *this)

{
  *(undefined ***)&this->field_0xf8 = &PTR__Object_007e6a70;
  *(undefined8 *)&this->field_0x100 = 0;
  *(char **)&this->field_0x108 = "IfcElementQuantity";
  IfcPropertySetDefinition::IfcPropertySetDefinition
            (&this->super_IfcPropertySetDefinition,&PTR_construction_vtable_24__0087d708);
  *(undefined8 *)&(this->super_IfcPropertySetDefinition).field_0xb0 = 0;
  (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x87d650;
  *(undefined8 *)&this->field_0xf8 = 0x87d6f0;
  *(undefined8 *)
   &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x88 =
       0x87d678;
  *(undefined8 *)
   &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x98 =
       0x87d6a0;
  *(undefined8 *)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.field_0xa8 =
       0x87d6c8;
  *(undefined1 **)&(this->super_IfcPropertySetDefinition).field_0xb8 = &this->field_0xc8;
  *(undefined8 *)&this->field_0xc0 = 0;
  this->field_0xc8 = 0;
  this->field_0xd8 = 0;
  (this->Quantities).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Quantities).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Quantities).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

IfcElementQuantity() : Object("IfcElementQuantity") {}